

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

void __kmp_release_template<kmp_flag_64>(kmp_flag_64 *flag)

{
  undefined1 *puVar1;
  bool bVar2;
  kmp_uint32 kVar3;
  void *pvVar4;
  kmp_info_t *pkVar5;
  kmp_basic_flag_native<unsigned_long_long> *in_RDI;
  int wait_gtid;
  kmp_info_t *waiter;
  uint i;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  kmp_uint32 kVar6;
  kmp_uint32 local_c;
  
  puVar1 = __kmp_itt_fsync_releasing_ptr__3_0;
  if (__kmp_itt_fsync_releasing_ptr__3_0 != (undefined1 *)0x0) {
    pvVar4 = kmp_flag_native<unsigned_long_long>::get_void_p
                       (&in_RDI->super_kmp_flag_native<unsigned_long_long>);
    (*(code *)puVar1)(pvVar4);
  }
  kmp_basic_flag_native<unsigned_long_long>::internal_release
            ((kmp_basic_flag_native<unsigned_long_long> *)0x1790c5);
  if ((__kmp_dflt_blocktime != 0x7fffffff) &&
     (bVar2 = kmp_basic_flag_native<unsigned_long_long>::is_any_sleeping
                        ((kmp_basic_flag_native<unsigned_long_long> *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)), bVar2)) {
    local_c = 0;
    while (kVar6 = local_c,
          kVar3 = kmp_basic_flag_native<unsigned_long_long>::get_num_waiters(in_RDI), kVar6 < kVar3)
    {
      pkVar5 = kmp_basic_flag_native<unsigned_long_long>::get_waiter(in_RDI,local_c);
      if (pkVar5 != (kmp_info_t *)0x0) {
        kmp_flag_64::resume((kmp_flag_64 *)CONCAT44(kVar6,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
      }
      local_c = local_c + 1;
    }
  }
  return;
}

Assistant:

static inline void __kmp_release_template(C *flag) {
#ifdef KMP_DEBUG
  int gtid = TCR_4(__kmp_init_gtid) ? __kmp_get_gtid() : -1;
#endif
  KF_TRACE(20, ("__kmp_release: T#%d releasing flag(%x)\n", gtid, flag->get()));
  KMP_DEBUG_ASSERT(flag->get());
  KMP_FSYNC_RELEASING(flag->get_void_p());

  flag->internal_release();

  KF_TRACE(100, ("__kmp_release: T#%d set new spin=%d\n", gtid, flag->get(),
                 flag->load()));

  if (__kmp_dflt_blocktime != KMP_MAX_BLOCKTIME) {
    // Only need to check sleep stuff if infinite block time not set.
    // Are *any* threads waiting on flag sleeping?
    if (flag->is_any_sleeping()) {
      for (unsigned int i = 0; i < flag->get_num_waiters(); ++i) {
        // if sleeping waiter exists at i, sets current_waiter to i inside flag
        kmp_info_t *waiter = flag->get_waiter(i);
        if (waiter) {
          int wait_gtid = waiter->th.th_info.ds.ds_gtid;
          // Wake up thread if needed
          KF_TRACE(50, ("__kmp_release: T#%d waking up thread T#%d since sleep "
                        "flag(%p) set\n",
                        gtid, wait_gtid, flag->get()));
          flag->resume(wait_gtid); // unsets flag's current_waiter when done
        }
      }
    }
  }
}